

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter.cpp
# Opt level: O1

void __thiscall Assimp::AMFImporter::Throw_ID_NotFound(AMFImporter *this,string *pID)

{
  runtime_error *this_00;
  long *plVar1;
  long *plVar2;
  long *local_60;
  long local_58;
  long local_50;
  long lStack_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_40,"Not found node with name \"",pID);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_40);
  local_60 = (long *)*plVar1;
  plVar2 = plVar1 + 2;
  if (local_60 == plVar2) {
    local_50 = *plVar2;
    lStack_48 = plVar1[3];
    local_60 = &local_50;
  }
  else {
    local_50 = *plVar2;
  }
  local_58 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::runtime_error::runtime_error(this_00,(string *)&local_60);
  *(undefined ***)this_00 = &PTR__runtime_error_0082bce0;
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void AMFImporter::Throw_ID_NotFound(const std::string& pID) const
{
	throw DeadlyImportError("Not found node with name \"" + pID + "\".");
}